

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::NoPropagateOnCopy_CopyConstructorWithDifferentAlloc_Test::TestBody
          (NoPropagateOnCopy_CopyConstructorWithDifferentAlloc_Test *this)

{
  Table *this_00;
  Alloc *a;
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Table u;
  AssertHelper local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [8];
  element_type *peStack_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  local_78;
  
  this_00 = &(this->super_NoPropagateOnCopy).t1;
  local_90 = (undefined1  [8])((ulong)local_90 & 0xffffffff00000000);
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  ::insert<int,_0,_0,_nullptr>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>::iterator,_bool>
              *)&local_78,this_00,(int *)local_90);
  a = &(this->super_NoPropagateOnCopy).a2;
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  ::raw_hash_set(&local_78,this_00,a);
  local_90 = (undefined1  [8])
             local_78.settings_.
             super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
             .
             super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
             .
             super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
             .
             super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
             .
             super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
             ._M_head_impl.id_;
  peStack_88 = local_78.settings_.
               super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
               .
               super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
               .
               super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
               .
               super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
               .
               super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
               ._M_head_impl.state_.
               super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  local_80._M_pi =
       local_78.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
       ._M_head_impl.state_.
       super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_78.settings_.
      super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
      .
      super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
      .
      super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
      .
      super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
      .
      super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
      ._M_head_impl.state_.
      super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
       ._M_head_impl.state_.
       super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_78.settings_.
            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
            .
            super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
            .
            super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
            .
            super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
            .
            super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
            ._M_head_impl.state_.
            super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
       .
       super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
       ._M_head_impl.state_.
       super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_78.settings_.
            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
            .
            super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
            .
            super__Tuple_impl<2UL,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
            .
            super__Tuple_impl<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
            .
            super__Head_base<3UL,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_false>
            ._M_head_impl.state_.
            super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  testing::internal::EqHelper::
  Compare<phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>,_nullptr>
            ((EqHelper *)&local_a0,"a2","u.get_allocator()",a,
             (CheckedAlloc<phmap::priv::Tracked<int>,_6> *)local_90);
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if (local_a0._M_head_impl._0_1_ == (EqHelper)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0x10f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  local_a8.data_._0_4_ = 1;
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_NoPropagateOnCopy).a1.state_.
        super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->num_allocs;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_90,"1","a1.num_allocs()",(int *)&local_a8,(unsigned_long *)&local_a0)
  ;
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (peStack_88 == (element_type *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)&peStack_88->num_allocs)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0x110,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (peStack_88 != (element_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&peStack_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peStack_88);
  }
  local_a8.data_._0_4_ = 1;
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_NoPropagateOnCopy).a2.state_.
        super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->num_allocs;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_90,"1","a2.num_allocs()",(int *)&local_a8,(unsigned_long *)&local_a0)
  ;
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (peStack_88 == (element_type *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)&peStack_88->num_allocs)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0x111,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (peStack_88 != (element_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&peStack_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peStack_88);
  }
  local_a8.data_._0_4_ = 0;
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       *((local_78.slots_)->num_moves_).
        super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_90,"0","it->num_moves()",(int *)&local_a8,(unsigned_long *)&local_a0)
  ;
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (peStack_88 == (element_type *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)&peStack_88->num_allocs)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0x112,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (peStack_88 != (element_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&peStack_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peStack_88);
  }
  local_a8.data_._0_4_ = 1;
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       *((local_78.slots_)->num_copies_).
        super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_90,"1","it->num_copies()",(int *)&local_a8,(unsigned_long *)&local_a0
            );
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (peStack_88 == (element_type *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)&peStack_88->num_allocs)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0x113,pcVar1);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (peStack_88 != (element_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&peStack_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peStack_88);
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_6>_>
  ::~raw_hash_set(&local_78);
  return;
}

Assistant:

TEST_F(NoPropagateOnCopy, CopyConstructorWithDifferentAlloc) {
  auto it = t1.insert(0).first;
  Table u(t1, a2);
  EXPECT_EQ(a2, u.get_allocator());
  EXPECT_EQ(1, a1.num_allocs());
  EXPECT_EQ(1, a2.num_allocs());
  EXPECT_EQ(0, it->num_moves());
  EXPECT_EQ(1, it->num_copies());
}